

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaValPtr xmlSchemaNewStringValue(xmlSchemaValType type,xmlChar *value)

{
  xmlSchemaValPtr val;
  xmlChar *value_local;
  xmlSchemaValPtr pxStack_10;
  xmlSchemaValType type_local;
  
  if (type == XML_SCHEMAS_STRING) {
    pxStack_10 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
    if (pxStack_10 == (xmlSchemaValPtr)0x0) {
      pxStack_10 = (xmlSchemaValPtr)0x0;
    }
    else {
      memset(pxStack_10,0,0x30);
      pxStack_10->type = XML_SCHEMAS_STRING;
      (pxStack_10->value).qname.name = value;
    }
  }
  else {
    pxStack_10 = (xmlSchemaValPtr)0x0;
  }
  return pxStack_10;
}

Assistant:

xmlSchemaValPtr
xmlSchemaNewStringValue(xmlSchemaValType type,
			const xmlChar *value)
{
    xmlSchemaValPtr val;

    if (type != XML_SCHEMAS_STRING)
	return(NULL);
    val = (xmlSchemaValPtr) xmlMalloc(sizeof(xmlSchemaVal));
    if (val == NULL) {
	return(NULL);
    }
    memset(val, 0, sizeof(xmlSchemaVal));
    val->type = type;
    val->value.str = (xmlChar *) value;
    return(val);
}